

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msghash32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  code *pcVar8;
  ulong uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint uVar13;
  uint64_t uVar14;
  void *pvVar15;
  char *pcVar16;
  int ret;
  int local_284;
  uchar *local_280;
  uint local_274;
  uint local_270;
  int local_26c;
  secp256k1_scalar s;
  secp256k1_scalar non;
  secp256k1_modinv64_signed62 local_200;
  secp256k1_scalar r;
  secp256k1_scalar msg;
  secp256k1_scalar sec;
  secp256k1_scalar n;
  secp256k1_ge r_1;
  secp256k1_gej rp;
  uchar nonce32 [32];
  uchar b [32];
  
  local_280 = seckey;
  if ((ctx->ecmult_gen_ctx).built == 0) {
    pvVar15 = (ctx->illegal_callback).data;
    pcVar16 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  else if (msghash32 == (uchar *)0x0) {
    pvVar15 = (ctx->illegal_callback).data;
    pcVar16 = "msghash32 != NULL";
  }
  else if (signature == (secp256k1_ecdsa_signature *)0x0) {
    pvVar15 = (ctx->illegal_callback).data;
    pcVar16 = "signature != NULL";
  }
  else {
    if (seckey != (uchar *)0x0) {
      ret = 0;
      r.d[0] = 0;
      r.d[1] = 0;
      r.d[2] = 0;
      r.d[3] = 0;
      s.d[0] = 0;
      s.d[1] = 0;
      s.d[2] = 0;
      s.d[3] = 0;
      pcVar8 = nonce_function_rfc6979;
      if (noncefp != (secp256k1_nonce_function)0x0) {
        pcVar8 = noncefp;
      }
      local_274 = secp256k1_scalar_set_b32_seckey(&sec,seckey);
      secp256k1_scalar_cmov(&sec,&secp256k1_scalar_one,local_274 ^ 1);
      secp256k1_scalar_set_b32(&msg,msghash32,(int *)0x0);
      uVar13 = 0;
      while( true ) {
        iVar7 = (*pcVar8)(nonce32,msghash32,local_280,(uchar *)0x0,noncedata,uVar13);
        ret = (int)(iVar7 != 0);
        if (iVar7 == 0) break;
        local_284 = secp256k1_scalar_set_b32_seckey(&non,nonce32);
        secp256k1_declassify(ctx,&local_284,4);
        if (local_284 != 0) {
          local_26c = 0;
          secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&rp,&non);
          secp256k1_ge_set_gej(&r_1,&rp);
          secp256k1_fe_impl_normalize(&r_1.x);
          secp256k1_fe_impl_normalize(&r_1.y);
          local_270 = uVar13;
          secp256k1_fe_impl_get_b32(b,&r_1.x);
          secp256k1_scalar_set_b32(&r,b,&local_26c);
          secp256k1_scalar_mul(&n,&r,&sec);
          secp256k1_scalar_add(&n,&n,&msg);
          local_200.v[0] = non.d[0] & 0x3fffffffffffffff;
          local_200.v[1] = (non.d[1] & 0xfffffffffffffff) << 2 | non.d[0] >> 0x3e;
          local_200.v[2] = (non.d[2] & 0x3ffffffffffffff) << 4 | non.d[1] >> 0x3c;
          local_200.v[3] = (non.d[3] & 0xffffffffffffff) << 6 | non.d[2] >> 0x3a;
          local_200.v[4] = non.d[3] >> 0x38;
          secp256k1_modinv64(&local_200,&secp256k1_const_modinfo_scalar);
          secp256k1_scalar_from_signed62(&s,&local_200);
          secp256k1_scalar_mul(&s,&s,&n);
          n.d[2] = 0;
          n.d[3] = 0;
          n.d[0] = 0;
          n.d[1] = 0;
          rp.z.n[4] = 0;
          rp.infinity = 0;
          rp._124_4_ = 0;
          rp.z.n[2] = 0;
          rp.z.n[3] = 0;
          rp.z.n[0] = 0;
          rp.z.n[1] = 0;
          rp.y.n[3] = 0;
          rp.y.n[4] = 0;
          rp.y.n[1] = 0;
          rp.y.n[2] = 0;
          rp.x.n[4] = 0;
          rp.y.n[0] = 0;
          rp.x.n[2] = 0;
          rp.x.n[3] = 0;
          rp.x.n[0] = 0;
          rp.x.n[1] = 0;
          r_1.y.n[3] = 0;
          r_1.y.n[4] = 0;
          r_1.y.n[1] = 0;
          r_1.y.n[2] = 0;
          r_1.x.n[4] = 0;
          r_1.y.n[0] = 0;
          r_1.x.n[2] = 0;
          r_1.x.n[3] = 0;
          r_1.x.n[0] = 0;
          r_1.x.n[1] = 0;
          r_1.infinity = 0;
          r_1._84_4_ = 0;
          iVar7 = secp256k1_scalar_is_high(&s);
          uVar13 = local_270;
          local_200.v[0] = CONCAT44(local_200.v[0]._4_4_,iVar7);
          uVar9 = -(long)iVar7;
          uVar12 = (uVar9 & 0xbfd25e8cd0364142) + (s.d[0] ^ uVar9);
          uVar1 = (ulong)CARRY8(uVar9 & 0xbfd25e8cd0364142,s.d[0] ^ uVar9);
          uVar2 = (uVar9 & 0xbaaedce6af48a03b) + (s.d[1] ^ uVar9);
          uVar11 = uVar2 + uVar1;
          uVar1 = (ulong)(CARRY8(uVar9 & 0xbaaedce6af48a03b,s.d[1] ^ uVar9) || CARRY8(uVar2,uVar1));
          uVar2 = (uVar9 & 0xfffffffffffffffe) + (s.d[2] ^ uVar9);
          uVar10 = uVar2 + uVar1;
          uVar14 = ((s.d[3] ^ uVar9) - (long)iVar7) +
                   (ulong)(CARRY8(uVar9 & 0xfffffffffffffffe,s.d[2] ^ uVar9) || CARRY8(uVar2,uVar1))
          ;
          bVar5 = s.d[1] == 0;
          bVar6 = s.d[0] == 0;
          bVar4 = s.d[2] == 0;
          bVar3 = s.d[3] == 0;
          if (((bVar5 && bVar6) && bVar4) && bVar3) {
            uVar12 = 0;
          }
          if (((bVar5 && bVar6) && bVar4) && bVar3) {
            uVar11 = 0;
            uVar10 = 0;
          }
          s.d[1] = uVar11;
          s.d[0] = uVar12;
          if (((bVar5 && bVar6) && bVar4) && bVar3) {
            uVar14 = 0;
          }
          s.d[3] = uVar14;
          s.d[2] = uVar10;
          ret = (int)((((uVar11 != 0 || uVar12 != 0) || uVar10 != 0) || uVar14 != 0) &&
                     ((r.d[1] != 0 || r.d[3] != 0) || (r.d[0] != 0 || r.d[2] != 0)));
          secp256k1_declassify(ctx,&ret,4);
          if (ret != 0) goto LAB_001038fe;
        }
        uVar13 = uVar13 + 1;
      }
      ret = 0;
LAB_001038fe:
      uVar13 = ret & local_274;
      nonce32[0] = '\0';
      nonce32[1] = '\0';
      nonce32[2] = '\0';
      nonce32[3] = '\0';
      nonce32[4] = '\0';
      nonce32[5] = '\0';
      nonce32[6] = '\0';
      nonce32[7] = '\0';
      nonce32[8] = '\0';
      nonce32[9] = '\0';
      nonce32[10] = '\0';
      nonce32[0xb] = '\0';
      nonce32[0xc] = '\0';
      nonce32[0xd] = '\0';
      nonce32[0xe] = '\0';
      nonce32[0xf] = '\0';
      nonce32[0x10] = '\0';
      nonce32[0x11] = '\0';
      nonce32[0x12] = '\0';
      nonce32[0x13] = '\0';
      nonce32[0x14] = '\0';
      nonce32[0x15] = '\0';
      nonce32[0x16] = '\0';
      nonce32[0x17] = '\0';
      nonce32[0x18] = '\0';
      nonce32[0x19] = '\0';
      nonce32[0x1a] = '\0';
      nonce32[0x1b] = '\0';
      nonce32[0x1c] = '\0';
      nonce32[0x1d] = '\0';
      nonce32[0x1e] = '\0';
      nonce32[0x1f] = '\0';
      msg.d[2] = 0;
      msg.d[3] = 0;
      msg.d[0] = 0;
      msg.d[1] = 0;
      non.d[2] = 0;
      non.d[3] = 0;
      non.d[0] = 0;
      non.d[1] = 0;
      sec.d[2] = 0;
      sec.d[3] = 0;
      sec.d[0] = 0;
      sec.d[1] = 0;
      ret = uVar13;
      secp256k1_scalar_cmov(&r,&secp256k1_scalar_zero,(uint)(uVar13 == 0));
      secp256k1_scalar_cmov(&s,&secp256k1_scalar_zero,(uint)(uVar13 == 0));
      *(uint64_t *)(signature->data + 0x10) = r.d[2];
      *(uint64_t *)(signature->data + 0x18) = r.d[3];
      *(uint64_t *)signature->data = r.d[0];
      *(uint64_t *)(signature->data + 8) = r.d[1];
      *(uint64_t *)(signature->data + 0x20) = s.d[0];
      *(uint64_t *)(signature->data + 0x28) = s.d[1];
      *(uint64_t *)(signature->data + 0x30) = s.d[2];
      *(uint64_t *)(signature->data + 0x38) = s.d[3];
      return uVar13;
    }
    pvVar15 = (ctx->illegal_callback).data;
    pcVar16 = "seckey != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar16,pvVar15);
  return 0;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msghash32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, msghash32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}